

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessagePayload_payloadIsPresent_Test::TestBody
          (CoapTest_CoapMessagePayload_payloadIsPresent_Test *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  bool bVar1;
  char *pcVar2;
  element_type *this_00;
  ByteArray *lhs;
  AssertHelper local_128;
  Message local_120;
  allocator<unsigned_char> local_113;
  uchar local_112 [2];
  iterator local_110;
  size_type local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_100;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_2;
  Message local_d0;
  ErrorCode local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Message local_a8;
  void *local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  shared_ptr<ot::commissioner::coap::Message> message;
  Error error;
  allocator<unsigned_char> local_40;
  uchar local_3f [7];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  ByteArray buffer;
  CoapTest_CoapMessagePayload_payloadIsPresent_Test *this_local;
  
  local_3f[0] = '@';
  local_3f[1] = 0;
  local_3f[2] = 0;
  local_3f[3] = 0;
  local_3f[4] = 0xff;
  local_3f[5] = 0xfa;
  local_3f[6] = 0xce;
  local_38 = local_3f;
  local_30 = 7;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_char>::allocator(&local_40);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,__l_00,&local_40);
  std::allocator<unsigned_char>::~allocator(&local_40);
  Error::Error((Error *)&message.
                         super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
  Message::Deserialize
            ((Message *)&gtest_ar.message_,
             (Error *)&message.
                       super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount,(ByteArray *)local_28);
  local_a0 = (void *)0x0;
  testing::internal::CmpHelperNE<std::shared_ptr<ot::commissioner::coap::Message>,decltype(nullptr)>
            ((internal *)local_98,"message","nullptr",
             (shared_ptr<ot::commissioner::coap::Message> *)&gtest_ar.message_,&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x11d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_c4 = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_c0,"error","ErrorCode::kNone",
             (Error *)&message.
                       super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount,&local_c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x11e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  this_00 = std::
            __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&gtest_ar.message_);
  lhs = Message::GetPayload(this_00);
  local_112[0] = 0xfa;
  local_112[1] = 0xce;
  local_110 = local_112;
  local_108 = 2;
  std::allocator<unsigned_char>::allocator(&local_113);
  __l._M_len = local_108;
  __l._M_array = local_110;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_100,__l,&local_113);
  testing::internal::EqHelper::
  Compare<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((EqHelper *)local_e8,"message->GetPayload()","(ByteArray{0xfa, 0xce})",lhs,&local_100);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_100);
  std::allocator<unsigned_char>::~allocator(&local_113);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x11f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  std::shared_ptr<ot::commissioner::coap::Message>::~shared_ptr
            ((shared_ptr<ot::commissioner::coap::Message> *)&gtest_ar.message_);
  Error::~Error((Error *)&message.
                          super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  return;
}

Assistant:

TEST(CoapTest, CoapMessagePayload_payloadIsPresent)
{
    ByteArray buffer{0x40, 0x00, 0x00, 0x00, 0xFF, 0xfa, 0xce};
    Error     error;
    auto      message = Message::Deserialize(error, buffer);

    EXPECT_NE(message, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);
    EXPECT_EQ(message->GetPayload(), (ByteArray{0xfa, 0xce}));
}